

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  RhsNested pMVar2;
  ulong cols;
  ulong uVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  SrcEvaluatorType srcEvaluator;
  product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_58;
  double *local_30;
  ulong local_28;
  
  product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  ::product_evaluator(&local_58,&src->m_lhs);
  pMVar2 = src->m_rhs;
  local_30 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
  uVar9 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  cols = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_28 = uVar9;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar9) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    if ((long)(cols | uVar9) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar9 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)cols),0) <
        (long)uVar9)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = operator_delete;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar9,uVar9,cols);
  }
  uVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar3 == uVar9) &&
     (uVar9 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar9 == cols)) {
    pdVar4 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar7 = uVar9 * uVar3;
    uVar9 = lVar7 - (lVar7 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar7) {
      lVar10 = 0;
      do {
        dVar5 = (local_58.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 .m_data + lVar10)[1];
        dVar6 = (local_30 + lVar10)[1];
        pdVar1 = pdVar4 + lVar10;
        *pdVar1 = local_58.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  .m_data[lVar10] * local_30[lVar10];
        pdVar1[1] = dVar5 * dVar6;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)uVar9);
    }
    if ((long)uVar9 < lVar7) {
      do {
        pdVar4[uVar9] =
             local_58.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
             m_data[uVar9] * local_30[uVar9];
        uVar9 = uVar9 + 1;
      } while (lVar7 - uVar9 != 0);
    }
    free(local_58.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}